

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O0

void __thiscall Buffer::Members::~Members(Members *this)

{
  Members *this_local;
  
  if (((this->own_memory & 1U) != 0) && (this->buf != (uchar *)0x0)) {
    operator_delete__(this->buf);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Buffer::Members::~Members()
{
    if (this->own_memory) {
        delete[] this->buf;
    }
}